

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::start_note(Renderer *this,int chan,int note,int vel)

{
  BYTE BVar1;
  int iVar2;
  bool bVar3;
  uint note_00;
  Sample *pSVar4;
  Instrument *pIVar5;
  int iVar6;
  Sample *pSVar7;
  float f;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar6 = this->channel[chan].bank;
  note_00 = note & 0x7f;
  if (((uint)this->drumchannels >> (chan & 0x1fU) & 1) == 0) {
    iVar2 = this->channel[chan].program;
    if (iVar2 == -1) {
      pIVar5 = this->default_instrument;
    }
    else if ((((&tonebank)[iVar6] == 0) ||
             (pIVar5 = *(Instrument **)((&tonebank)[iVar6] + 8 + (long)iVar2 * 8),
             pIVar5 == (Instrument *)0x0)) &&
            (pIVar5 = *(Instrument **)(tonebank + 8 + (long)iVar2 * 8), pIVar5 == (Instrument *)0x0)
            ) {
      return;
    }
    if (pIVar5 == (Instrument *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/playmidi.cpp"
                    ,0x175,"void Timidity::Renderer::start_note(int, int, int)");
    }
  }
  else {
    if ((((&drumset)[iVar6] == 0) ||
        (pIVar5 = *(Instrument **)((&drumset)[iVar6] + 8 + (ulong)note_00 * 8),
        pIVar5 == (Instrument *)0x0)) &&
       (pIVar5 = *(Instrument **)(drumset + 8 + (ulong)note_00 * 8), pIVar5 == (Instrument *)0x0)) {
      return;
    }
    if (pIVar5 == (Instrument *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/playmidi.cpp"
                    ,0x15f,"void Timidity::Renderer::start_note(int, int, int)");
    }
    if ((pIVar5->samples != 1) && (pIVar5->sample->type == '\0')) {
      cmsg(1,1,"Strange: percussion instrument with %d samples!");
    }
  }
  pSVar4 = pIVar5->sample;
  if ((pSVar4 != (Sample *)0x0) && (iVar6 = pIVar5->samples, iVar6 != 0)) {
    BVar1 = pSVar4->type;
    if ((BVar1 == '\0') && (pSVar4->scale_factor != 0x400)) {
      dVar8 = (double)(int)pSVar4->tune * 0.01 + (double)(int)pSVar4->scale_note +
              (double)(int)((note_00 - (int)pSVar4->scale_note) * (uint)pSVar4->scale_factor) *
              0.0009765625;
    }
    else {
      dVar8 = (double)note_00;
    }
    dVar8 = exp2(dVar8 * 0.08333333333333333);
    f = (float)(dVar8 * 8175.798947309669);
    if (BVar1 == '\0') {
      if (iVar6 == 1) {
        start_region(this,chan,note_00,vel,pSVar4,f);
      }
      iVar6 = pIVar5->samples;
      if (iVar6 != 0) {
        pSVar4 = pIVar5->sample;
        do {
          if (((pSVar4->low_freq <= f) && (f < pSVar4->high_freq || f == pSVar4->high_freq)) &&
             ((iVar6 < 2 ||
              ((f < pSVar4[1].low_freq || (pSVar4[1].high_freq <= f && f != pSVar4[1].high_freq)))))
             ) goto LAB_00329cbc;
          pSVar4 = pSVar4 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      dVar8 = log((double)f * 0.00012231220538135425);
      pSVar4 = pIVar5->sample;
      iVar6 = pIVar5->samples;
      if (iVar6 != 0) {
        dVar10 = 10000000000.0;
        pSVar7 = pSVar4;
        do {
          dVar9 = log((double)pSVar7->root_freq * 0.00012231220538135425);
          dVar9 = ABS((dVar9 - dVar8) * 17.312340490667562);
          bVar3 = dVar9 < dVar10;
          if (dVar9 <= dVar10) {
            dVar10 = dVar9;
          }
          if (bVar3) {
            pSVar4 = pSVar7;
          }
          pSVar7 = pSVar7 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
LAB_00329cbc:
      start_region(this,chan,note_00,vel,pSVar4,f);
      return;
    }
    while (((((vel < (int)(uint)pSVar4->low_vel || ((int)(uint)pSVar4->high_vel < vel)) ||
             (f < pSVar4->low_freq)) ||
            ((pSVar4->high_freq <= f && f != pSVar4->high_freq ||
             (bVar3 = start_region(this,chan,note_00,vel,pSVar4,f), bVar3)))) &&
           (iVar6 = iVar6 + -1, iVar6 != 0))) {
      pSVar4 = pSVar4 + 1;
    }
  }
  return;
}

Assistant:

void Renderer::start_note(int chan, int note, int vel)
{
	Instrument *ip;
	Sample *sp;
	int bank = channel[chan].bank;
	int prog = channel[chan].program;
	int i;
	float f;

	note &= 0x7f;
	if (ISDRUMCHANNEL(chan))
	{
		if (NULL == drumset[bank] || NULL == (ip = drumset[bank]->instrument[note]))
		{
			if (!(ip = drumset[0]->instrument[note]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
		if (ip->samples != 1 && ip->sample->type == INST_GUS)
		{
			cmsg(CMSG_WARNING, VERB_VERBOSE, 
				"Strange: percussion instrument with %d samples!", ip->samples);
		}
	}
	else
	{
		if (channel[chan].program == SPECIAL_PROGRAM)
		{
			ip = default_instrument;
		}
		else if (NULL == tonebank[bank] || NULL == (ip = tonebank[bank]->instrument[prog]))
		{
			if (NULL == (ip = tonebank[0]->instrument[prog]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
	}

	if (NULL == ip->sample || ip->samples == 0)
		return;	/* No samples? Then nothing to play. */

	// For GF1 patches, scaling is based solely on the first
	// waveform in this layer.
	if (ip->sample->type == INST_GUS && ip->sample->scale_factor != 1024)
	{
		f = calculate_scaled_frequency(ip->sample, note);
	}
	else
	{
		f = note_to_freq(note);
	}

	if (ip->sample->type == INST_GUS)
	{
		/* We're more lenient with matching ranges for GUS patches, since the
		 * official Gravis ones don't cover the full range of possible
		 * frequencies for every instrument.
		 */
		if (ip->samples == 1)
		{ // If there's only one sample, definitely play it.
			start_region(chan, note, vel, ip->sample, f);
		}
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			// GUS patches don't have velocity ranges, so no need to compare against them.
			if (sp->low_freq <= f && sp->high_freq >= f)
			{
				if (i > 1 && (sp + 1)->low_freq <= f && (sp + 1)->high_freq >= f)
				{ /* If there is a range of contiguous regions that match our
				   * desired frequency, the last one in that block is used.
				   */
					continue;
				}
				start_region(chan, note, vel, sp, f);
				break;
			}
		}
		if (i == 0)
		{ /* Found nothing. Try again, but look for the one with the closest root frequency.
		   * As per the suggestion in the original TiMidity function, this search uses
		   * note values rather than raw frequencies.
		   */
			double cdiff = 1e10;
			double want_note = freq_to_note(f);
			Sample *closest = sp = ip->sample;
			for (i = ip->samples; i != 0; --i, ++sp)
			{
				double diff = fabs(freq_to_note(sp->root_freq) - want_note);
				if (diff < cdiff)
				{
					cdiff = diff;
					closest = sp;
				}
			}
			start_region(chan, note, vel, closest, f);
		}
	}
	else
	{
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			if ((sp->low_vel <= vel && sp->high_vel >= vel &&
				 sp->low_freq <= f && sp->high_freq >= f))
			{
				if (!start_region(chan, note, vel, sp, f))
				{ // Ran out of voices
					break;
				}
			}
		}
	}
}